

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  uint uVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  nk_draw_index nVar8;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  short sVar9;
  undefined8 uVar10;
  void *pvVar11;
  void *pvVar12;
  float number;
  nk_vec2 nVar13;
  nk_vec2 nVar14;
  float local_16c;
  nk_draw_index *local_160;
  nk_draw_index *ids_1;
  void *vtx_1;
  nk_size vtx_count_1;
  nk_size idx_count_1;
  nk_size index_1;
  nk_size i_1;
  float scale;
  float dmr2;
  float local_100;
  nk_vec2 local_f8;
  nk_vec2 dm;
  nk_vec2 n1;
  nk_vec2 n0;
  nk_vec2 uv;
  float local_cc;
  float fStack_c8;
  float len;
  nk_vec2 diff;
  nk_vec2 p1;
  nk_vec2 p0;
  uint vtx_outer_idx;
  uint vtx_inner_idx;
  nk_vec2 *normals;
  nk_size size;
  nk_draw_index *ids;
  void *vtx;
  nk_size vtx_count;
  nk_size idx_count;
  nk_size index;
  nk_size vertex_offset;
  ulong uStack_60;
  float AA_SIZE;
  nk_size i1;
  nk_size i0;
  nk_size i;
  nk_colorf col_trans;
  nk_colorf col;
  nk_anti_aliasing aliasing_local;
  uint points_count_local;
  nk_vec2 *points_local;
  nk_draw_list *list_local;
  nk_color color_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x20f1,
                  "void nk_draw_list_fill_poly_convex(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_anti_aliasing)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (2 < points_count)) {
    list_local._4_4_ =
         (nk_color)
         CONCAT13((nk_byte)(int)((float)((uint)color >> 0x18) * (list->config).global_alpha),
                  color._0_3_);
    nk_color_fv(&col_trans.b,list_local._4_4_);
    uVar10 = col_trans._8_8_;
    col_trans.r = col.r;
    col_trans.g = 0.0;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      uVar1 = list->vertex_count;
      pvVar11 = nk_draw_list_alloc_vertices(list,(ulong)(points_count << 1));
      size = (nk_size)nk_draw_list_alloc_elements(list,(ulong)(points_count * 9 - 6));
      sVar9 = (short)uVar1;
      sVar7 = sVar9 + 1;
      if ((pvVar11 != (void *)0x0) && ((nk_draw_index *)size != (nk_draw_index *)0x0)) {
        pvVar2 = (list->vertices->memory).ptr;
        nk_buffer_mark(list->vertices,NK_BUFFER_FRONT);
        pvVar12 = nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,(ulong)points_count << 3,4);
        if (pvVar12 == (void *)0x0) {
          __assert_fail("normals",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x2117,
                        "void nk_draw_list_fill_poly_convex(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_anti_aliasing)"
                       );
        }
        if (pvVar12 != (void *)0x0) {
          ids = (nk_draw_index *)
                ((long)pvVar11 + ((long)(list->vertices->memory).ptr - (long)pvVar2));
          for (i0 = 2; i0 < points_count; i0 = i0 + 1) {
            *(short *)size = sVar9;
            *(short *)(size + 2) = sVar9 + ((short)i0 + -1) * 2;
            *(short *)(size + 4) = sVar9 + (short)i0 * 2;
            size = size + 6;
          }
          i1 = (nk_size)(points_count - 1);
          for (uStack_60 = 0; uStack_60 < points_count; uStack_60 = uStack_60 + 1) {
            diff.x = points[uStack_60].x;
            diff.y = points[uStack_60].y;
            p1.x = points[i1].x;
            p1.y = points[i1].y;
            nVar13 = nk_vec2(diff.x - p1.x,diff.y - p1.y);
            fStack_c8 = nVar13.x;
            len = nVar13.y;
            number = fStack_c8 * fStack_c8 + len * len;
            if ((number != 0.0) || (NAN(number))) {
              local_cc = nk_inv_sqrt(number);
            }
            else {
              local_cc = 1.0;
            }
            nVar13 = nk_vec2(fStack_c8 * local_cc,len * local_cc);
            len = nVar13.y;
            *(float *)((long)pvVar12 + i1 * 8) = len;
            fStack_c8 = nVar13.x;
            *(float *)((long)pvVar12 + i1 * 8 + 4) = -fStack_c8;
            i1 = uStack_60;
          }
          i1 = (nk_size)(points_count - 1);
          for (uStack_60 = 0; uStack_60 < points_count; uStack_60 = uStack_60 + 1) {
            nVar13 = (list->config).null.uv;
            uVar3 = *(undefined8 *)((long)pvVar12 + i1 * 8);
            uVar4 = *(undefined8 *)((long)pvVar12 + uStack_60 * 8);
            n1.x = (float)uVar3;
            n1.y = (float)((ulong)uVar3 >> 0x20);
            dm.x = (float)uVar4;
            dm.y = (float)((ulong)uVar4 >> 0x20);
            nVar14 = nk_vec2(n1.x + dm.x,n1.y + dm.y);
            local_100 = nVar14.x;
            nVar14 = nk_vec2(n1.x + dm.x,n1.y + dm.y);
            dmr2 = nVar14.y;
            local_f8 = nk_vec2(local_100 * 0.5,dmr2 * 0.5);
            local_16c = local_f8.x * local_f8.x + local_f8.y * local_f8.y;
            if (1e-06 < local_16c) {
              local_16c = 1.0 / local_16c;
              if (100.0 <= local_16c) {
                local_16c = 100.0;
              }
              local_f8 = nk_vec2(local_f8.x * local_16c,local_f8.y * local_16c);
            }
            nVar14 = nk_vec2(local_f8.x * 0.5,local_f8.y * 0.5);
            local_f8.x = nVar14.x;
            local_f8.y = nVar14.y;
            nVar14 = nk_vec2(points[uStack_60].x - local_f8.x,points[uStack_60].y - local_f8.y);
            color_01._8_8_ = col._0_8_;
            color_01.r = col_trans.b;
            color_01.g = col_trans.a;
            pvVar11 = nk_draw_vertex(ids,&list->config,nVar14,nVar13,color_01);
            nVar14 = nk_vec2(points[uStack_60].x + local_f8.x,points[uStack_60].y + local_f8.y);
            uVar3 = col_trans._8_8_;
            color_00.b = col_trans.r;
            col_trans.b = (float)uVar10;
            col_trans.a = SUB84(uVar10,4);
            color_00.r = col_trans.b;
            color_00.g = col_trans.a;
            color_00.a = col_trans.g;
            col_trans._8_8_ = uVar3;
            ids = (nk_draw_index *)nk_draw_vertex(pvVar11,&list->config,nVar14,nVar13,color_00);
            sVar5 = (short)uStack_60;
            *(short *)size = sVar9 + sVar5 * 2;
            sVar6 = (short)i1;
            *(short *)(size + 2) = sVar9 + sVar6 * 2;
            *(short *)(size + 4) = sVar7 + sVar6 * 2;
            *(short *)(size + 6) = sVar7 + sVar6 * 2;
            *(short *)(size + 8) = sVar7 + sVar5 * 2;
            *(short *)(size + 10) = sVar9 + sVar5 * 2;
            size = size + 0xc;
            i1 = uStack_60;
          }
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
        }
      }
    }
    else {
      uVar1 = list->vertex_count;
      ids_1 = (nk_draw_index *)nk_draw_list_alloc_vertices(list,(ulong)points_count);
      local_160 = nk_draw_list_alloc_elements(list,(ulong)((points_count - 2) * 3));
      if ((ids_1 != (nk_draw_index *)0x0) && (local_160 != (nk_draw_index *)0x0)) {
        for (index_1 = 0; index_1 < points_count; index_1 = index_1 + 1) {
          color_02._8_8_ = col._0_8_;
          color_02.r = col_trans.b;
          color_02.g = col_trans.a;
          ids_1 = (nk_draw_index *)
                  nk_draw_vertex(ids_1,&list->config,points[index_1],(list->config).null.uv,color_02
                                );
        }
        for (index_1 = 2; index_1 < points_count; index_1 = index_1 + 1) {
          nVar8 = (nk_draw_index)uVar1;
          *local_160 = nVar8;
          local_160[1] = (nVar8 + (short)index_1) - 1;
          local_160[2] = nVar8 + (short)index_1;
          local_160 = local_160 + 3;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
    const struct nk_vec2 *points, const unsigned int points_count,
    struct nk_color color, enum nk_anti_aliasing aliasing)
{
    struct nk_colorf col;
    struct nk_colorf col_trans;

    NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
    NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
    NK_ASSERT(list);
    if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        nk_size i = 0;
        nk_size i0 = 0;
        nk_size i1 = 0;

        const float AA_SIZE = 1.0f;
        nk_size vertex_offset = 0;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (points_count-2)*3 + points_count*6;
        const nk_size vtx_count = (points_count*2);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size = 0;
        struct nk_vec2 *normals = 0;
        unsigned int vtx_inner_idx = (unsigned int)(index + 0);
        unsigned int vtx_outer_idx = (unsigned int)(index + 1);
        if (!vtx || !ids) return;

        /* temporary allocate normals */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        NK_ASSERT(normals);
        if (!normals) return;
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* add elements */
        for (i = 2; i < points_count; i++) {
            ids[0] = (nk_draw_index)(vtx_inner_idx);
            ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
            ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
            ids += 3;
        }

        /* compute normals */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            struct nk_vec2 p0 = points[i0];
            struct nk_vec2 p1 = points[i1];
            struct nk_vec2 diff = nk_vec2_sub(p1, p0);

            /* vec2 inverted length  */
            float len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            normals[i0].x = diff.y;
            normals[i0].y = -diff.x;
        }

        /* add vertices + indexes */
        for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
            const struct nk_vec2 uv = list->config.null.uv;
            struct nk_vec2 n0 = normals[i0];
            struct nk_vec2 n1 = normals[i1];
            struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f) {
                float scale = 1.0f / dmr2;
                scale = NK_MIN(scale, 100.0f);
                dm = nk_vec2_muls(dm, scale);
            }
            dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

            /* add vertices */
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

            /* add indexes */
            ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
            ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
            ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
            ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
            ids += 6;
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        nk_size i = 0;
        nk_size index = list->vertex_count;
        const nk_size idx_count = (points_count-2)*3;
        const nk_size vtx_count = points_count;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        if (!vtx || !ids) return;
        for (i = 0; i < vtx_count; ++i)
            vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
        for (i = 2; i < points_count; ++i) {
            ids[0] = (nk_draw_index)index;
            ids[1] = (nk_draw_index)(index+ i - 1);
            ids[2] = (nk_draw_index)(index+i);
            ids += 3;
        }
    }
}